

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O1

bool __thiscall
cmParsePHPCoverage::ReadCoverageArray(cmParsePHPCoverage *this,istream *in,string *fileName)

{
  cmCTest *pcVar1;
  pointer piVar2;
  iterator __position;
  cmParsePHPCoverage *this_00;
  size_t sVar3;
  long *plVar4;
  int iVar5;
  cmParsePHPCoverage *pcVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  char c;
  int size;
  int value;
  char buf [4];
  ostringstream cmCTestLog_msg;
  char local_1dd;
  int local_1dc;
  int local_1d8;
  undefined4 uStack_1d4;
  long local_1c8 [2];
  undefined4 local_1b4;
  int local_1b0;
  uint local_1ac;
  undefined1 local_1a8 [376];
  
  this_00 = (cmParsePHPCoverage *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->Coverage->TotalCoverage,fileName);
  pcVar6 = (cmParsePHPCoverage *)in;
  std::istream::read((char *)in,(long)&local_1ac);
  local_1ac = local_1ac & 0xffffff;
  if (local_1ac == 0x3a613b) {
    local_1dc = 0;
    ReadInt(pcVar6,in,&local_1dc);
    pcVar6 = (cmParsePHPCoverage *)in;
    plVar4 = (long *)std::istream::get((char *)in);
    bVar9 = (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0;
    local_1b4 = (undefined4)CONCAT71((int7)((ulong)&local_1dd >> 8),local_1dd != '{' || bVar9);
    if (local_1dd != '{' || bVar9) {
      if (0 < local_1dc) {
        iVar7 = 0;
        do {
          ReadUntil(pcVar6,in,':');
          local_1a8._0_4_ = 0;
          ReadInt(pcVar6,in,(int *)local_1a8);
          if ((int)local_1a8._0_4_ < 2) {
            local_1a8._0_4_ = 1;
          }
          local_1a8._0_4_ = local_1a8._0_4_ - 1;
          uVar8 = (ulong)(uint)local_1a8._0_4_;
          ReadUntil(pcVar6,in,':');
          local_1d8 = 0;
          ReadInt(pcVar6,in,&local_1d8);
          while( true ) {
            piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&this_00->Coverage)->_M_impl).
                     super__Vector_impl_data._M_start;
            __position._M_current = (int *)this_00->CTest;
            if (uVar8 < (ulong)((long)__position._M_current - (long)piVar2 >> 2)) break;
            local_1b0 = -1;
            if ((cmCTestCoverageHandlerContainer *)__position._M_current == this_00[1].Coverage) {
              pcVar6 = this_00;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)this_00,__position,&local_1b0);
            }
            else {
              *__position._M_current = -1;
              this_00->CTest = (cmCTest *)(__position._M_current + 1);
            }
          }
          if (local_1d8 < 1) {
            local_1d8 = 0;
          }
          iVar5 = piVar2[uVar8];
          if (iVar5 == -1) {
            iVar5 = 0;
          }
          piVar2[uVar8] = iVar5 + local_1d8;
          iVar7 = iVar7 + 1;
        } while (iVar7 < local_1dc);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"failed to read open {\n",0x16);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                   ,0x3b,(char *)CONCAT44(uStack_1d4,local_1d8),false);
      if ((long *)CONCAT44(uStack_1d4,local_1d8) != local_1c8) {
        operator_delete((long *)CONCAT44(uStack_1d4,local_1d8),local_1c8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"failed to read start of coverage array, found : ",0x30);
    sVar3 = strlen((char *)&local_1ac);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)&local_1ac,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x32,(char *)CONCAT44(uStack_1d4,local_1d8),false);
    if ((long *)CONCAT44(uStack_1d4,local_1d8) != local_1c8) {
      operator_delete((long *)CONCAT44(uStack_1d4,local_1d8),local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    local_1b4._0_1_ = 0;
  }
  return (bool)(undefined1)local_1b4;
}

Assistant:

bool cmParsePHPCoverage::ReadCoverageArray(std::istream& in,
                                           std::string const& fileName)
{
  cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
    this->Coverage.TotalCoverage[fileName];

  char c;
  char buf[4];
  in.read(buf, 3);
  buf[3] = 0;
  if (strcmp(buf, ";a:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of coverage array, found : " << buf
                                                                  << "\n");
    return false;
  }
  int size = 0;
  if (!this->ReadInt(in, size)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read size ");
    return false;
  }
  if (!in.get(c) && c == '{') {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read open {\n");
    return false;
  }
  for (int i = 0; i < size; i++) {
    this->ReadUntil(in, ':');
    int line = 0;
    this->ReadInt(in, line);
    // ok xdebug may have a bug here
    // it seems to be 1 based but often times
    // seems to have a 0'th line.
    line--;
    if (line < 0) {
      line = 0;
    }
    this->ReadUntil(in, ':');
    int value = 0;
    this->ReadInt(in, value);
    // make sure the vector is the right size and is
    // initialized with -1 for each line
    while (coverageVector.size() <= static_cast<size_t>(line)) {
      coverageVector.push_back(-1);
    }
    // if value is less than 0, set it to zero
    // TODO figure out the difference between
    // -1 and -2 in xdebug coverage??  For now
    // assume less than 0 is just not covered
    // CDash expects -1 for non executable code (like comments)
    // and 0 for uncovered code, and a positive value
    // for number of times a line was executed
    if (value < 0) {
      value = 0;
    }
    // if unset then set it to value
    if (coverageVector[line] == -1) {
      coverageVector[line] = value;
    }
    // otherwise increment by value
    else {
      coverageVector[line] += value;
    }
  }
  return true;
}